

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

ostream * __thiscall amrex::BoxArray::writeOn(BoxArray *this,ostream *os)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ostream *poVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  IntVect IVar16;
  Box result;
  Box bx;
  char local_99;
  undefined8 local_98;
  uint uStack_90;
  uint auStack_8c [2];
  undefined8 uStack_84;
  Box local_78;
  element_type *local_50;
  ostream *local_48;
  int local_40 [3];
  
  local_78.smallend.vect[0]._0_1_ = 0x28;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_78,1);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  local_78.smallend.vect[0]._0_1_ = 0x20;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_78,1);
  uVar12 = 0;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
  local_78.smallend.vect[0]._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_78,1);
  local_50 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar13 = (int)((long)*(pointer *)
                        ((long)&(local_50->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data + 8) -
                 *(long *)&(local_50->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data >> 2) * -0x49249249;
  switch((this->m_bat).m_bat_type) {
  case null:
    if (0 < (int)uVar13) {
      uVar10 = (ulong)(uVar13 & 0x7fffffff);
      lVar7 = 0;
      do {
        poVar5 = amrex::operator<<(os,(Box *)(*(long *)&(local_50->m_abox).
                                                                                                                
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data + lVar7));
        local_78.smallend.vect[0]._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_78,1);
        lVar7 = lVar7 + 0x1c;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    goto LAB_00548b83;
  case indexType:
  case indexType_coarsenRatio:
    uVar12 = *(uint *)&(this->m_bat).m_op;
    break;
  case coarsenRatio:
    break;
  case bndryReg:
    if (0 < (int)uVar13) {
      uVar10 = (ulong)(uVar13 & 0x7fffffff);
      lVar7 = 0;
      do {
        BATbndryReg::operator()
                  (&local_78,&(this->m_bat).m_op.m_bndryReg,
                   (Box *)(*(long *)&(local_50->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data + lVar7));
        poVar5 = amrex::operator<<(os,&local_78);
        local_98 = CONCAT71(local_98._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_98,1);
        lVar7 = lVar7 + 0x1c;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    goto LAB_00548b83;
  default:
    uVar12 = *(uint *)((long)&(this->m_bat).m_op + 4);
  }
  local_48 = os;
  IVar16 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar8 = IVar16.vect[2];
  local_40[0] = IVar16.vect[0];
  local_40[1] = IVar16.vect[1];
  local_40[2] = IVar16.vect[2];
  os = local_48;
  if (0 < (int)uVar13) {
    iVar14 = IVar16.vect[0];
    iVar15 = IVar16.vect[1];
    uVar10 = 0;
    do {
      lVar7 = *(long *)&(local_50->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data;
      plVar1 = (long *)(lVar7 + uVar10 * 0x1c);
      lVar11 = *plVar1;
      lVar2 = plVar1[1];
      plVar1 = (long *)(lVar7 + 0xc + uVar10 * 0x1c);
      lVar7 = *plVar1;
      lVar3 = plVar1[1];
      auStack_8c[1] = (uint)((ulong)lVar7 >> 0x20);
      uStack_84 = lVar3;
      uStack_90 = (uint)lVar2;
      auStack_8c[0] = (uint)((ulong)lVar2 >> 0x20);
      local_98._4_4_ = (uint)((ulong)lVar11 >> 0x20);
      uVar6 = local_98._4_4_;
      if (iVar15 == 1 && iVar14 == 1) {
        local_98 = lVar11;
        if (iVar8 != 1) goto LAB_00548860;
      }
      else {
        local_98._0_4_ = (uint)lVar11;
        if (iVar14 != 1) {
          if (iVar14 == 4) {
            if ((int)(uint)local_98 < 0) {
              local_98._0_4_ = (int)(uint)local_98 >> 2;
            }
            else {
              local_98._0_4_ = (uint)local_98 >> 2;
            }
          }
          else if (iVar14 == 2) {
            if ((int)(uint)local_98 < 0) {
              local_98._0_4_ = (int)(uint)local_98 >> 1;
            }
            else {
              local_98._0_4_ = (uint)local_98 >> 1;
            }
          }
          else if ((int)(uint)local_98 < 0) {
            local_98._0_4_ = ~((int)~(uint)local_98 / iVar14);
          }
          else {
            local_98._0_4_ = (int)(uint)local_98 / iVar14;
          }
        }
        if (iVar15 != 1) {
          if (iVar15 == 4) {
            if (lVar11 < 0) {
              uVar6 = (int)local_98._4_4_ >> 2;
            }
            else {
              uVar6 = local_98._4_4_ >> 2;
            }
          }
          else if (iVar15 == 2) {
            if (lVar11 < 0) {
              uVar6 = (int)local_98._4_4_ >> 1;
            }
            else {
              uVar6 = local_98._4_4_ >> 1;
            }
          }
          else if (lVar11 < 0) {
            uVar6 = ~((int)~local_98._4_4_ / iVar15);
          }
          else {
            uVar6 = (int)local_98._4_4_ / iVar15;
          }
        }
LAB_00548860:
        local_98 = CONCAT44(uVar6,(uint)local_98);
        if (iVar8 != 1) {
          if (iVar8 == 4) {
            if ((int)uStack_90 < 0) {
              uStack_90 = (int)uStack_90 >> 2;
            }
            else {
              uStack_90 = uStack_90 >> 2;
            }
          }
          else if (iVar8 == 2) {
            if ((int)uStack_90 < 0) {
              uStack_90 = (int)uStack_90 >> 1;
            }
            else {
              uStack_90 = uStack_90 >> 1;
            }
          }
          else if ((int)uStack_90 < 0) {
            uStack_90 = ~((int)~uStack_90 / iVar8);
          }
          else {
            uStack_90 = (int)uStack_90 / iVar8;
          }
        }
        uStack_84._4_4_ = (uint)((ulong)lVar3 >> 0x20);
        uStack_84._0_4_ = (uint)lVar3;
        if (uStack_84._4_4_ == 0) {
          uVar6 = auStack_8c[0];
          if (iVar14 != 1) {
            if (iVar14 == 4) {
              uVar6 = (int)auStack_8c[0] >> 2;
              if (-1 < lVar2) {
                uVar6 = auStack_8c[0] >> 2;
              }
            }
            else if (iVar14 == 2) {
              uVar6 = (int)auStack_8c[0] >> 1;
              if (-1 < lVar2) {
                uVar6 = auStack_8c[0] >> 1;
              }
            }
            else if (lVar2 < 0) {
              uVar6 = ~((int)~auStack_8c[0] / iVar14);
            }
            else {
              uVar6 = (int)auStack_8c[0] / iVar14;
            }
          }
          auStack_8c[0] = uVar6;
          uVar6 = auStack_8c[1];
          if (iVar15 != 1) {
            if (iVar15 == 4) {
              uVar6 = (int)auStack_8c[1] >> 2;
              if (-1 < lVar7) {
                uVar6 = auStack_8c[1] >> 2;
              }
            }
            else if (iVar15 == 2) {
              uVar6 = (int)auStack_8c[1] >> 1;
              if (-1 < lVar7) {
                uVar6 = auStack_8c[1] >> 1;
              }
            }
            else if (lVar7 < 0) {
              uVar6 = ~((int)~auStack_8c[1] / iVar15);
            }
            else {
              uVar6 = (int)auStack_8c[1] / iVar15;
            }
          }
          auStack_8c[1] = uVar6;
          uVar6 = (uint)uStack_84;
          if (iVar8 != 1) {
            if (iVar8 == 4) {
              uVar6 = (int)(uint)uStack_84 >> 2;
              if (-1 < (int)(uint)uStack_84) {
                uVar6 = (uint)uStack_84 >> 2;
              }
            }
            else if (iVar8 == 2) {
              uVar6 = (int)(uint)uStack_84 >> 1;
              if (-1 < (int)(uint)uStack_84) {
                uVar6 = (uint)uStack_84 >> 1;
              }
            }
            else if ((int)(uint)uStack_84 < 0) {
              uVar6 = ~((int)~(uint)uStack_84 / iVar8);
            }
            else {
              uVar6 = (int)(uint)uStack_84 / iVar8;
            }
          }
        }
        else {
          local_78.smallend.vect[0] = 0;
          local_78.smallend.vect[1] = 0;
          local_78.smallend.vect[2] = 0;
          lVar11 = 0;
          do {
            if (((uStack_84._4_4_ >> ((uint)lVar11 & 0x1f) & 1) != 0) &&
               ((int)auStack_8c[lVar11] % local_40[lVar11] != 0)) {
              local_78.smallend.vect[lVar11] = 1;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          uVar6 = auStack_8c[0];
          if (iVar14 != 1) {
            if (iVar14 == 4) {
              uVar6 = (int)auStack_8c[0] >> 2;
              if (-1 < lVar2) {
                uVar6 = auStack_8c[0] >> 2;
              }
            }
            else if (iVar14 == 2) {
              uVar6 = (int)auStack_8c[0] >> 1;
              if (-1 < lVar2) {
                uVar6 = auStack_8c[0] >> 1;
              }
            }
            else if (lVar2 < 0) {
              uVar6 = ~((int)~auStack_8c[0] / iVar14);
            }
            else {
              uVar6 = (int)auStack_8c[0] / iVar14;
            }
          }
          uVar9 = auStack_8c[1];
          if (iVar15 != 1) {
            if (iVar15 == 4) {
              uVar9 = (int)auStack_8c[1] >> 2;
              if (-1 < lVar7) {
                uVar9 = auStack_8c[1] >> 2;
              }
            }
            else if (iVar15 == 2) {
              uVar9 = (int)auStack_8c[1] >> 1;
              if (-1 < lVar7) {
                uVar9 = auStack_8c[1] >> 1;
              }
            }
            else if (lVar7 < 0) {
              uVar9 = ~((int)~auStack_8c[1] / iVar15);
            }
            else {
              uVar9 = (int)auStack_8c[1] / iVar15;
            }
          }
          uVar4 = (uint)uStack_84;
          if (iVar8 != 1) {
            if (iVar8 == 4) {
              uVar4 = (int)(uint)uStack_84 >> 2;
              if (-1 < (int)(uint)uStack_84) {
                uVar4 = (uint)uStack_84 >> 2;
              }
            }
            else if (iVar8 == 2) {
              uVar4 = (int)(uint)uStack_84 >> 1;
              if (-1 < (int)(uint)uStack_84) {
                uVar4 = (uint)uStack_84 >> 1;
              }
            }
            else if ((int)(uint)uStack_84 < 0) {
              uVar4 = ~((int)~(uint)uStack_84 / iVar8);
            }
            else {
              uVar4 = (int)(uint)uStack_84 / iVar8;
            }
          }
          auStack_8c[0] = uVar6 + local_78.smallend.vect[0];
          auStack_8c[1] = uVar9 + local_78.smallend.vect[1];
          uVar6 = uVar4 + local_78.smallend.vect[2];
        }
        uStack_84 = CONCAT44(uStack_84._4_4_,uVar6);
      }
      local_78.bigend.vect[1] = auStack_8c[1];
      local_78.bigend.vect[2] = (uint)uStack_84;
      local_78.smallend.vect[0] = (uint)local_98;
      local_78.smallend.vect[1] = local_98._4_4_;
      local_78.smallend.vect[2] = uStack_90;
      local_78.bigend.vect[0] = auStack_8c[0];
      lVar7 = 0;
      local_78.btype.itype = uStack_84._4_4_;
      do {
        uVar9 = 1 << ((byte)lVar7 & 0x1f);
        uVar6 = (uint)lVar7;
        local_78.bigend.vect[lVar7] =
             (local_78.bigend.vect[lVar7] + (uint)((uVar12 >> (uVar6 & 0x1f) & 1) != 0)) -
             (uint)((local_78.btype.itype >> (uVar6 & 0x1f) & 1) != 0);
        if ((uVar12 >> (uVar6 & 0x1f) & 1) == 0) {
          local_78.btype.itype = ~uVar9 & local_78.btype.itype;
        }
        else {
          local_78.btype.itype = uVar9 | local_78.btype.itype;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      poVar5 = amrex::operator<<(local_48,&local_78);
      local_99 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_99,1);
      uVar10 = uVar10 + 1;
      os = local_48;
    } while (uVar10 != (uVar13 & 0x7fffffff));
  }
LAB_00548b83:
  local_78.smallend.vect[0]._0_1_ = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_78,1);
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("BoxArray::writeOn(ostream&) failed");
  }
  return os;
}

Assistant:

std::ostream&
BoxArray::writeOn (std::ostream& os) const
{
    //
    // TODO -- completely remove the fiction of a hash value.
    //
    os << '(' << size() << ' ' << 0 << '\n';

    const int N = size();
    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
        for (int i = 0; i < N; ++i) {
            os << bxs[i] << '\n';
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
        for (int i = 0; i < N; ++i) {
            os << amrex::convert(amrex::coarsen(bxs[i],cr),t) << '\n';
        }
    } else {
        for (int i = 0; i < N; ++i) {
            os << m_bat.m_op.m_bndryReg(bxs[i]) << '\n';
        }
    }

    os << ')';

    if (os.fail())
        amrex::Error("BoxArray::writeOn(ostream&) failed");

    return os;
}